

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall wasm::RefAs::finalize(RefAs *this)

{
  RefAsOp RVar1;
  Nullability nullable;
  HeapType heapType;
  Type *this_00;
  Type local_20;
  
  if ((this->value->type).id == 1) {
    (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = 1;
  }
  else {
    this_00 = &this->value->type;
    RVar1 = this->op;
    if (RVar1 == ExternExternalize) {
      nullable = wasm::Type::getNullability(this_00);
      heapType.id = 0;
    }
    else if (RVar1 == ExternInternalize) {
      nullable = wasm::Type::getNullability(this_00);
      heapType.id = 2;
    }
    else {
      if (RVar1 != RefAsNonNull) {
        handle_unreachable("invalid ref.as_*",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                           ,0x47a);
      }
      heapType = wasm::Type::getHeapType(this_00);
      nullable = NonNullable;
    }
    wasm::Type::Type(&local_20,heapType,nullable);
    (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
         local_20.id;
  }
  return;
}

Assistant:

void RefAs::finalize() {
  if (value->type == Type::unreachable) {
    type = Type::unreachable;
    return;
  }
  switch (op) {
    case RefAsNonNull:
      type = Type(value->type.getHeapType(), NonNullable);
      break;
    case ExternInternalize:
      type = Type(HeapType::any, value->type.getNullability());
      break;
    case ExternExternalize:
      type = Type(HeapType::ext, value->type.getNullability());
      break;
    default:
      WASM_UNREACHABLE("invalid ref.as_*");
  }
}